

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TextureDerivateCase::TextureDerivateCase
          (TextureDerivateCase *this,Context *context,char *name,char *description,DerivateFunc func
          ,DataType type,Precision precision,deUint32 hint,SurfaceType surfaceType,int numSamples)

{
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TriangleDerivateCase).super_TestCase.m_context = context;
  (this->super_TriangleDerivateCase).m_fragmentSrc._M_dataplus._M_p =
       (pointer)&(this->super_TriangleDerivateCase).m_fragmentSrc.field_2;
  (this->super_TriangleDerivateCase).m_fragmentSrc._M_string_length = 0;
  (this->super_TriangleDerivateCase).m_fragmentSrc.field_2._M_local_buf[0] = '\0';
  (this->super_TriangleDerivateCase).m_coordMin.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMin.m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_coordMax.m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_derivScale.m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[1] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[2] = 0.0;
  (this->super_TriangleDerivateCase).m_derivBias.m_data[3] = 0.0;
  (this->super_TriangleDerivateCase).m_surfaceType = SURFACETYPE_DEFAULT_FRAMEBUFFER;
  (this->super_TriangleDerivateCase).m_numSamples = 0;
  (this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureDerivateCase_02197c58;
  *(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4 = func;
  (this->m_texValueMin).m_data[0] = 0.0;
  (this->m_texValueMin).m_data[1] = 0.0;
  (this->m_texValueMin).m_data[2] = 0.0;
  (this->m_texValueMin).m_data[3] = 0.0;
  (this->m_texValueMax).m_data[0] = 0.0;
  (this->m_texValueMax).m_data[1] = 0.0;
  (this->m_texValueMax).m_data[2] = 0.0;
  (this->m_texValueMax).m_data[3] = 0.0;
  this->m_texture = (Texture2D *)0x0;
  (this->super_TriangleDerivateCase).m_dataType = type;
  (this->super_TriangleDerivateCase).m_precision = precision;
  (this->super_TriangleDerivateCase).m_coordDataType = TYPE_FLOAT_VEC2;
  (this->super_TriangleDerivateCase).m_coordPrecision = PRECISION_LAST;
  (this->super_TriangleDerivateCase).m_coordPrecision = PRECISION_HIGHP;
  (this->super_TriangleDerivateCase).m_hint = hint;
  (this->super_TriangleDerivateCase).m_surfaceType = surfaceType;
  (this->super_TriangleDerivateCase).m_numSamples = numSamples;
  return;
}

Assistant:

TextureDerivateCase::TextureDerivateCase (Context& context, const char* name, const char* description, DerivateFunc func, glu::DataType type, glu::Precision precision, deUint32 hint, SurfaceType surfaceType, int numSamples)
	: TriangleDerivateCase	(context, name, description)
	, m_func				(func)
	, m_texture				(DE_NULL)
{
	m_dataType			= type;
	m_precision			= precision;
	m_coordDataType		= glu::TYPE_FLOAT_VEC2;
	m_coordPrecision	= glu::PRECISION_HIGHP;
	m_hint				= hint;
	m_surfaceType		= surfaceType;
	m_numSamples		= numSamples;
}